

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD3Loader.cpp
# Opt level: O0

bool Assimp::Q3Shader::LoadShader(ShaderData *fill,string *pFile,IOSystem *io)

{
  bool bVar1;
  int iVar2;
  BlendFunc BVar3;
  IOStream *__p;
  pointer pIVar4;
  Logger *pLVar5;
  basic_formatter *this;
  undefined4 extraout_var;
  size_type __n;
  reference pvVar6;
  AlphaTestFunc *this_00;
  char **extraout_RDX;
  char **extraout_RDX_00;
  char **in;
  char **in_00;
  char **in_01;
  char **in_02;
  char **in_03;
  string local_350;
  ShaderDataBlock local_330;
  undefined1 local_2f0 [8];
  string at;
  undefined1 local_2b0 [8];
  string blend_src;
  ShaderMapBlock local_270;
  reference local_240;
  ShaderMapBlock *curMap;
  ShaderDataBlock *curData;
  char *buff;
  undefined1 local_220 [8];
  vector<char,_std::allocator<char>_> _buff;
  size_t s;
  string local_88;
  undefined4 local_68;
  allocator<char> local_51;
  string local_50;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> local_30;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> file;
  IOSystem *io_local;
  string *pFile_local;
  ShaderData *fill_local;
  
  file._M_t.super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>._M_t.
  super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>.
  super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl =
       (__uniq_ptr_data<Assimp::IOStream,_std::default_delete<Assimp::IOStream>,_true,_true>)
       (__uniq_ptr_data<Assimp::IOStream,_std::default_delete<Assimp::IOStream>,_true,_true>)io;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"rt",&local_51);
  __p = IOSystem::Open(io,pFile,&local_50);
  std::unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>>::
  unique_ptr<std::default_delete<Assimp::IOStream>,void>
            ((unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>> *)&local_30,__p);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  pIVar4 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::get(&local_30)
  ;
  if (pIVar4 == (pointer)0x0) {
    fill_local._7_1_ = false;
    local_68 = 1;
  }
  else {
    pLVar5 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[28]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)&s,
               (char (*) [28])"Loading Quake3 shader file ");
    this = (basic_formatter *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                     ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&s,pFile)
    ;
    Formatter::basic_formatter::operator_cast_to_string(&local_88,this);
    Logger::info(pLVar5,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    ~basic_formatter((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)&s);
    pIVar4 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::operator->
                       (&local_30);
    iVar2 = (*pIVar4->_vptr_IOStream[6])();
    _buff.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ =
         CONCAT44(extraout_var,iVar2);
    __n = _buff.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ + 1;
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_220,__n,
               (allocator_type *)((long)&buff + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&buff + 7));
    pIVar4 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::operator->
                       (&local_30);
    pvVar6 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)local_220,0);
    (*pIVar4->_vptr_IOStream[2])
              (pIVar4,pvVar6,_buff.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_,1)
    ;
    pvVar6 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)local_220,
                        _buff.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_);
    *pvVar6 = '\0';
    pvVar6 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)local_220,0);
    CommentRemover::RemoveLineComments("//",pvVar6,' ');
    curData = (ShaderDataBlock *)
              std::vector<char,_std::allocator<char>_>::operator[]
                        ((vector<char,_std::allocator<char>_> *)local_220,0);
    curMap = (ShaderMapBlock *)0x0;
    local_240 = (reference)0x0;
    while (bVar1 = SkipSpacesAndLineEnd<char>((char **)&curData), bVar1) {
      if ((curData->name)._M_dataplus == (_Alloc_hider)0x7b) {
        curData = (ShaderDataBlock *)&(curData->name).field_0x1;
        if (curMap == (ShaderMapBlock *)0x0) {
          pLVar5 = DefaultLogger::get();
          Logger::error(pLVar5,"Q3Shader: Unexpected shader section token \'{\'");
          break;
        }
        while (bVar1 = SkipSpacesAndLineEnd<char>((char **)&curData), bVar1) {
          if ((curData->name)._M_dataplus == (_Alloc_hider)0x7b) {
            curData = (ShaderDataBlock *)&(curData->name).field_0x1;
            this_00 = &curMap->alpha_test;
            ShaderMapBlock::ShaderMapBlock(&local_270);
            std::__cxx11::
            list<Assimp::Q3Shader::ShaderMapBlock,_std::allocator<Assimp::Q3Shader::ShaderMapBlock>_>
            ::push_back((list<Assimp::Q3Shader::ShaderMapBlock,_std::allocator<Assimp::Q3Shader::ShaderMapBlock>_>
                         *)this_00,&local_270);
            ShaderMapBlock::~ShaderMapBlock(&local_270);
            local_240 = std::__cxx11::
                        list<Assimp::Q3Shader::ShaderMapBlock,_std::allocator<Assimp::Q3Shader::ShaderMapBlock>_>
                        ::back((list<Assimp::Q3Shader::ShaderMapBlock,_std::allocator<Assimp::Q3Shader::ShaderMapBlock>_>
                                *)&curMap->alpha_test);
            while (bVar1 = SkipSpacesAndLineEnd<char>((char **)&curData), bVar1) {
              bVar1 = TokenMatchI((char **)&curData,"map",3);
              in = extraout_RDX;
              if ((bVar1) ||
                 (bVar1 = TokenMatchI((char **)&curData,"clampmap",8), in = extraout_RDX_00, bVar1))
              {
                GetNextToken_abi_cxx11_
                          ((string *)((long)&blend_src.field_2 + 8),(Assimp *)&curData,in);
                std::__cxx11::string::operator=
                          ((string *)local_240,(string *)(blend_src.field_2._M_local_buf + 8));
                std::__cxx11::string::~string((string *)(blend_src.field_2._M_local_buf + 8));
              }
              else {
                bVar1 = TokenMatchI((char **)&curData,"blendfunc",9);
                if (bVar1) {
                  GetNextToken_abi_cxx11_((string *)local_2b0,(Assimp *)&curData,in_00);
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_2b0,"add");
                  if (bVar1) {
                    local_240->blend_src = BLEND_GL_ONE;
                    local_240->blend_dest = BLEND_GL_ONE;
                  }
                  else {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_2b0,"filter");
                    if (bVar1) {
                      local_240->blend_src = BLEND_GL_DST_COLOR;
                      local_240->blend_dest = BLEND_GL_ZERO;
                    }
                    else {
                      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_2b0,"blend");
                      if (bVar1) {
                        local_240->blend_src = BLEND_GL_SRC_ALPHA;
                        local_240->blend_dest = BLEND_GL_ONE_MINUS_SRC_ALPHA;
                      }
                      else {
                        BVar3 = StringToBlendFunc((string *)local_2b0);
                        local_240->blend_src = BVar3;
                        GetNextToken_abi_cxx11_
                                  ((string *)((long)&at.field_2 + 8),(Assimp *)&curData,in_01);
                        BVar3 = StringToBlendFunc((string *)((long)&at.field_2 + 8));
                        local_240->blend_dest = BVar3;
                        std::__cxx11::string::~string((string *)(at.field_2._M_local_buf + 8));
                      }
                    }
                  }
                  std::__cxx11::string::~string((string *)local_2b0);
                }
                else {
                  bVar1 = TokenMatchI((char **)&curData,"alphafunc",9);
                  if (bVar1) {
                    GetNextToken_abi_cxx11_((string *)local_2f0,(Assimp *)&curData,in_02);
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_2f0,"GT0");
                    if (bVar1) {
                      local_240->alpha_test = AT_GT0;
                    }
                    else {
                      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_2f0,"LT128");
                      if (bVar1) {
                        local_240->alpha_test = AT_LT128;
                      }
                      else {
                        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)local_2f0,"GE128");
                        if (bVar1) {
                          local_240->alpha_test = AT_GE128;
                        }
                      }
                    }
                    std::__cxx11::string::~string((string *)local_2f0);
                  }
                  else if ((curData->name)._M_dataplus == (_Alloc_hider)0x7d) {
                    curData = (ShaderDataBlock *)&(curData->name).field_0x1;
                    local_240 = (reference)0x0;
                    break;
                  }
                }
              }
              SkipLine<char>((char **)&curData);
            }
          }
          else {
            if ((curData->name)._M_dataplus == (_Alloc_hider)0x7d) {
              curData = (ShaderDataBlock *)&(curData->name).field_0x1;
              curMap = (ShaderMapBlock *)0x0;
              break;
            }
            bVar1 = TokenMatchI((char **)&curData,"cull",4);
            if (bVar1) {
              SkipSpaces<char>((char **)&curData);
              iVar2 = ASSIMP_strincmp((char *)curData,"back",4);
              if (iVar2 == 0) {
                curMap->blend_src = BLEND_GL_ZERO;
              }
              else {
                iVar2 = ASSIMP_strincmp((char *)curData,"front",5);
                if (iVar2 == 0) {
                  curMap->blend_src = BLEND_GL_ONE;
                }
                else {
                  iVar2 = ASSIMP_strincmp((char *)curData,"none",4);
                  if ((iVar2 == 0) ||
                     (iVar2 = ASSIMP_strincmp((char *)curData,"disable",7), iVar2 == 0)) {
                    curMap->blend_src = BLEND_NONE;
                  }
                  else {
                    pLVar5 = DefaultLogger::get();
                    Logger::error(pLVar5,"Q3Shader: Unrecognized cull mode");
                  }
                }
              }
            }
          }
          SkipLine<char>((char **)&curData);
        }
      }
      else {
        ShaderDataBlock::ShaderDataBlock(&local_330);
        std::__cxx11::
        list<Assimp::Q3Shader::ShaderDataBlock,_std::allocator<Assimp::Q3Shader::ShaderDataBlock>_>
        ::push_back(&fill->blocks,&local_330);
        ShaderDataBlock::~ShaderDataBlock(&local_330);
        curMap = (ShaderMapBlock *)
                 std::__cxx11::
                 list<Assimp::Q3Shader::ShaderDataBlock,_std::allocator<Assimp::Q3Shader::ShaderDataBlock>_>
                 ::back(&fill->blocks);
        GetNextToken_abi_cxx11_(&local_350,(Assimp *)&curData,in_03);
        std::__cxx11::string::operator=((string *)curMap,(string *)&local_350);
        std::__cxx11::string::~string((string *)&local_350);
      }
      SkipLine<char>((char **)&curData);
    }
    fill_local._7_1_ = true;
    local_68 = 1;
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)local_220);
  }
  std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::~unique_ptr(&local_30);
  return fill_local._7_1_;
}

Assistant:

bool Q3Shader::LoadShader(ShaderData& fill, const std::string& pFile,IOSystem* io)
{
    std::unique_ptr<IOStream> file( io->Open( pFile, "rt"));
    if (!file.get())
        return false; // if we can't access the file, don't worry and return

    ASSIMP_LOG_INFO_F("Loading Quake3 shader file ", pFile);

    // read file in memory
    const size_t s = file->FileSize();
    std::vector<char> _buff(s+1);
    file->Read(&_buff[0],s,1);
    _buff[s] = 0;

    // remove comments from it (C++ style)
    CommentRemover::RemoveLineComments("//",&_buff[0]);
    const char* buff = &_buff[0];

    Q3Shader::ShaderDataBlock* curData = NULL;
    Q3Shader::ShaderMapBlock*  curMap  = NULL;

    // read line per line
    for (;SkipSpacesAndLineEnd(&buff);SkipLine(&buff)) {

        if (*buff == '{') {
            ++buff;

            // append to last section, if any
            if (!curData) {
                ASSIMP_LOG_ERROR("Q3Shader: Unexpected shader section token \'{\'");
                return true; // still no failure, the file is there
            }

            // read this data section
            for (;SkipSpacesAndLineEnd(&buff);SkipLine(&buff)) {
                if (*buff == '{') {
                    ++buff;
                    // add new map section
                    curData->maps.push_back(Q3Shader::ShaderMapBlock());
                    curMap = &curData->maps.back();

                    for (;SkipSpacesAndLineEnd(&buff);SkipLine(&buff)) {
                        // 'map' - Specifies texture file name
                        if (TokenMatchI(buff,"map",3) || TokenMatchI(buff,"clampmap",8)) {
                            curMap->name = GetNextToken(buff);
                        }
                        // 'blendfunc' - Alpha blending mode
                        else if (TokenMatchI(buff,"blendfunc",9)) {
                            const std::string blend_src = GetNextToken(buff);
                            if (blend_src == "add") {
                                curMap->blend_src  = Q3Shader::BLEND_GL_ONE;
                                curMap->blend_dest = Q3Shader::BLEND_GL_ONE;
                            }
                            else if (blend_src == "filter") {
                                curMap->blend_src  = Q3Shader::BLEND_GL_DST_COLOR;
                                curMap->blend_dest = Q3Shader::BLEND_GL_ZERO;
                            }
                            else if (blend_src == "blend") {
                                curMap->blend_src  = Q3Shader::BLEND_GL_SRC_ALPHA;
                                curMap->blend_dest = Q3Shader::BLEND_GL_ONE_MINUS_SRC_ALPHA;
                            }
                            else {
                                curMap->blend_src  = StringToBlendFunc(blend_src);
                                curMap->blend_dest = StringToBlendFunc(GetNextToken(buff));
                            }
                        }
                        // 'alphafunc' - Alpha testing mode
                        else if (TokenMatchI(buff,"alphafunc",9)) {
                            const std::string at = GetNextToken(buff);
                            if (at == "GT0") {
                                curMap->alpha_test = Q3Shader::AT_GT0;
                            }
                            else if (at == "LT128") {
                                curMap->alpha_test = Q3Shader::AT_LT128;
                            }
                            else if (at == "GE128") {
                                curMap->alpha_test = Q3Shader::AT_GE128;
                            }
                        }
                        else if (*buff == '}') {
                            ++buff;
                            // close this map section
                            curMap = NULL;
                            break;
                        }
                    }

                }
                else if (*buff == '}') {
                    ++buff;
                    curData = NULL;
                    break;
                }

                // 'cull' specifies culling behaviour for the model
                else if (TokenMatchI(buff,"cull",4)) {
                    SkipSpaces(&buff);
                    if (!ASSIMP_strincmp(buff,"back",4)) {
                        curData->cull = Q3Shader::CULL_CCW;
                    } else if (!ASSIMP_strincmp(buff,"front",5)) {
                        curData->cull = Q3Shader::CULL_CW;
                    } else if (!ASSIMP_strincmp(buff,"none",4) || !ASSIMP_strincmp(buff,"disable",7)) {
                        curData->cull = Q3Shader::CULL_NONE;
                    } else {
                        ASSIMP_LOG_ERROR("Q3Shader: Unrecognized cull mode");
                    }
                }
            }
        } else {
            // add new section
            fill.blocks.push_back(Q3Shader::ShaderDataBlock());
            curData = &fill.blocks.back();

            // get the name of this section
            curData->name = GetNextToken(buff);
        }
    }
    return true;
}